

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_mesh.cc
# Opt level: O0

string * lf::io::test_utils::getMeshPath(string *__return_storage_ptr__,string *mesh_name)

{
  size_type sVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string directory_path;
  int i;
  char count;
  char separator;
  int index;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string file_path;
  string *mesh_name_local;
  
  file_path.field_2._8_8_ = mesh_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/test_utils/read_mesh.cc"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  i = 0;
  directory_path.field_2._M_local_buf[0xe] = '\x02';
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  directory_path.field_2._8_4_ = (undefined4)sVar1;
  do {
    directory_path.field_2._8_4_ = directory_path.field_2._8_4_ + -1;
    if ((int)directory_path.field_2._8_4_ < 0) goto LAB_003d7024;
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38,SEXT48(directory_path.field_2._8_4_));
  } while (((*pvVar2 != '/') &&
           (pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,SEXT48(directory_path.field_2._8_4_)), *pvVar2 != '\\'
           )) || (directory_path.field_2._M_local_buf[0xe] =
                       directory_path.field_2._M_local_buf[0xe] + -1,
                 directory_path.field_2._M_local_buf[0xe] != '\0'));
  i = directory_path.field_2._8_4_;
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                      SEXT48(directory_path.field_2._8_4_));
  directory_path.field_2._M_local_buf[0xf] = *pvVar2;
LAB_003d7024:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,0,
             (long)(i + 1));
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "test");
  std::operator+(&local_d8,&local_f8,directory_path.field_2._M_local_buf[0xf]);
  std::operator+(&local_b8,&local_d8,"msh_files");
  std::operator+(&local_98,&local_b8,directory_path.field_2._M_local_buf[0xf]);
  std::operator+(__return_storage_ptr__,&local_98,mesh_name);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getMeshPath(std::string mesh_name) {
  std::string file_path = __FILE__;
  // std file_path(__FILE__);
  // get directory: go up two directories last index of / or backslash
  int index = 0;
  char separator;
  char count = 2;
  for (int i = file_path.length() - 1; i >= 0; --i) {
    if (file_path[i] == '/' || file_path[i] == '\\') {
      --count;
      if (count == 0) {
        index = i;
        separator = file_path[i];
        break;
      }
    }
  }
  std::string directory_path = file_path.substr(0, index + 1);
  return directory_path + "test" + separator + "msh_files" + separator +
         mesh_name;
}